

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint huffmanDecodeSymbol(uchar *in,size_t *bp,HuffmanTree *codetree,size_t inbitlength)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar4 = *bp;
  uVar5 = 0;
  while( true ) {
    if (inbitlength <= sVar4) {
      return 0xffffffff;
    }
    uVar6 = sVar4 >> 3;
    bVar3 = (byte)sVar4;
    sVar4 = sVar4 + 1;
    uVar1 = codetree->tree2d[(in[uVar6] >> (bVar3 & 7) & 1) + uVar5 * 2];
    *bp = sVar4;
    uVar2 = codetree->numcodes;
    uVar5 = uVar1 - uVar2;
    if (uVar1 < uVar2) break;
    if (uVar2 <= uVar5) {
      return 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

static unsigned huffmanDecodeSymbol(const unsigned char* in, size_t* bp,
                                    const HuffmanTree* codetree, size_t inbitlength)
{
  unsigned treepos = 0, ct;
  for(;;)
  {
    if(*bp >= inbitlength) return (unsigned)(-1); /*error: end of input memory reached without endcode*/
    /*
    decode the symbol from the tree. The "readBitFromStream" code is inlined in
    the expression below because this is the biggest bottleneck while decoding
    */
    ct = codetree->tree2d[(treepos << 1) + READBIT(*bp, in)];
    ++(*bp);
    if(ct < codetree->numcodes) return ct; /*the symbol is decoded, return it*/
    else treepos = ct - codetree->numcodes; /*symbol not yet decoded, instead move tree position*/

    if(treepos >= codetree->numcodes) return (unsigned)(-1); /*error: it appeared outside the codetree*/
  }
}